

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SPxSolverBase(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  ~SPxSolverBase(this);
  operator_delete(this,0xdc8);
  return;
}

Assistant:

SPxSolverBase<R>::~SPxSolverBase()
   {
      assert(!freePricer || thepricer != nullptr);
      assert(!freeRatioTester || theratiotester != nullptr);
      assert(!freeStarter || thestarter != nullptr);

      if(freePricer)
      {
         delete thepricer;
         thepricer = nullptr;
      }

      if(freeRatioTester)
      {
         delete theratiotester;
         theratiotester = nullptr;
      }

      if(freeStarter)
      {
         delete thestarter;
         thestarter = nullptr;
      }

      // free the timers
      assert(theTime);
      assert(multTimeSparse);
      assert(multTimeFull);
      assert(multTimeColwise);
      assert(multTimeUnsetup);
      theTime->~Timer();
      multTimeSparse->~Timer();
      multTimeFull->~Timer();
      multTimeColwise->~Timer();
      multTimeUnsetup->~Timer();
      spx_free(theTime);
      spx_free(multTimeSparse);
      spx_free(multTimeFull);
      spx_free(multTimeColwise);
      spx_free(multTimeUnsetup);
   }